

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_scope.c
# Opt level: O0

l2_scope_guid
l2_scope_create_scope(l2_scope_guid src,l2_scope_create_flag cf,l2_scope_type scope_type)

{
  _l2_scope *p_Var1;
  l2_symbol_node *plVar2;
  _l2_scope *local_28;
  l2_scope *scope_p;
  l2_scope_type scope_type_local;
  l2_scope_create_flag cf_local;
  l2_scope_guid src_local;
  
  if (cf == L2_SCOPE_CREATE_SUB_SCOPE) {
    if (src->lower_p == (_l2_scope *)0x0) {
      p_Var1 = (_l2_scope *)l2_storage_mem_new_with_zero(g_parser_p->storage_p,0x38);
      src->lower_p = p_Var1;
      src->lower_p->guid = src->lower_p;
      src->lower_p->level = src->level + 1;
      src->lower_p->upper_p = src;
      src->lower_p->lower_p = (_l2_scope *)0x0;
      src->lower_p->scope_type = scope_type;
      plVar2 = l2_symbol_table_create();
      src->lower_p->symbol_table_p = plVar2;
      src_local = src->lower_p;
    }
    else {
      for (local_28 = src->lower_p; local_28->coor_p != (_l2_scope *)0x0;
          local_28 = local_28->coor_p) {
      }
      p_Var1 = (_l2_scope *)l2_storage_mem_new_with_zero(g_parser_p->storage_p,0x38);
      local_28->coor_p = p_Var1;
      local_28->coor_p->guid = local_28->coor_p;
      local_28->coor_p->level = src->level + 1;
      local_28->coor_p->upper_p = src;
      local_28->coor_p->lower_p = (_l2_scope *)0x0;
      local_28->coor_p->scope_type = scope_type;
      plVar2 = l2_symbol_table_create();
      local_28->coor_p->symbol_table_p = plVar2;
      src_local = local_28->coor_p;
    }
  }
  else {
    if (cf != L2_SCOPE_CREATE_COORDINATE_SCOPE) {
      l2_internal_error(L2_INTERNAL_ERROR_UNREACHABLE_CODE,anon_var_dwarf_23f1);
    }
    local_28 = src;
    if (src->upper_p == (_l2_scope *)0x0) {
      l2_internal_error(L2_INTERNAL_ERROR_ILLEGAL_OPERATION,anon_var_dwarf_23d3);
    }
    for (; local_28->coor_p != (_l2_scope *)0x0; local_28 = local_28->coor_p) {
    }
    p_Var1 = (_l2_scope *)l2_storage_mem_new_with_zero(g_parser_p->storage_p,0x38);
    local_28->coor_p = p_Var1;
    local_28->coor_p->guid = local_28->coor_p;
    local_28->coor_p->level = src->level;
    local_28->coor_p->upper_p = src->upper_p;
    local_28->coor_p->lower_p = (_l2_scope *)0x0;
    local_28->coor_p->scope_type = scope_type;
    plVar2 = l2_symbol_table_create();
    local_28->coor_p->symbol_table_p = plVar2;
    src_local = local_28->coor_p;
  }
  return src_local;
}

Assistant:

l2_scope_guid l2_scope_create_scope(l2_scope_guid src, l2_scope_create_flag cf, l2_scope_type scope_type) {
    l2_scope *scope_p = L2_NULL_PTR;
    switch(cf) {
        case L2_SCOPE_CREATE_SUB_SCOPE:
            if (src->lower_p) {
                scope_p = src->lower_p;
                while (scope_p->coor_p) scope_p = scope_p->coor_p;

                scope_p->coor_p = l2_storage_mem_new_with_zero(g_parser_p->storage_p, sizeof(l2_scope));
                scope_p->coor_p->guid = scope_p->coor_p;
                scope_p->coor_p->level = src->level + 1;
                scope_p->coor_p->upper_p = src;
                scope_p->coor_p->lower_p = L2_NULL_PTR;
                scope_p->coor_p->scope_type = scope_type;
                scope_p->coor_p->symbol_table_p = l2_symbol_table_create();
                return scope_p->coor_p;

            } else {
                src->lower_p = l2_storage_mem_new_with_zero(g_parser_p->storage_p, sizeof(l2_scope));
                src->lower_p->guid = src->lower_p;
                src->lower_p->level = src->level + 1;
                src->lower_p->upper_p = src;
                src->lower_p->lower_p = L2_NULL_PTR;
                src->lower_p->scope_type = scope_type;
                src->lower_p->symbol_table_p = l2_symbol_table_create();
                return src->lower_p;
            }

        case L2_SCOPE_CREATE_COORDINATE_SCOPE:
            if (!src->upper_p)
                l2_internal_error(L2_INTERNAL_ERROR_ILLEGAL_OPERATION, "无法在全局作用域邻近位置创建平行的作用域");

            scope_p = src;
            while (scope_p->coor_p) scope_p = scope_p->coor_p;

            scope_p->coor_p = l2_storage_mem_new_with_zero(g_parser_p->storage_p, sizeof(l2_scope));
            scope_p->coor_p->guid = scope_p->coor_p;
            scope_p->coor_p->level = src->level;
            scope_p->coor_p->upper_p = src->upper_p;
            scope_p->coor_p->lower_p = L2_NULL_PTR;
            scope_p->coor_p->scope_type = scope_type;
            scope_p->coor_p->symbol_table_p = l2_symbol_table_create();
            return scope_p->coor_p;

        default:
            l2_internal_error(L2_INTERNAL_ERROR_UNREACHABLE_CODE, "出现意外错误，运行至不可达的代码块");
    }
}